

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::UnloadAllDocuments(Context *this)

{
  pointer ppEVar1;
  int iVar2;
  Element *pEVar3;
  ElementDocument *_document;
  
  pEVar3 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  while( true ) {
    iVar2 = Element::GetNumChildren(pEVar3,true);
    if (iVar2 < 1) break;
    pEVar3 = Element::GetChild((this->root)._M_t.
                               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,0);
    _document = Element::GetOwnerDocument(pEVar3);
    UnloadDocument(this,_document);
    pEVar3 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  }
  ppEVar1 = (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppEVar1) {
    (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppEVar1;
  }
  ppEVar1 = (this->hover_chain).m_container.
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->hover_chain).m_container.
      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar1) {
    (this->hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar1;
  }
  ppEVar1 = (this->drag_hover_chain).m_container.
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->drag_hover_chain).m_container.
      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar1) {
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar1;
  }
  return;
}

Assistant:

void Context::UnloadAllDocuments()
{
	// Unload all children.
	while (root->GetNumChildren(true) > 0)
		UnloadDocument(root->GetChild(0)->GetOwnerDocument());

	// The element lists may point to elements that are getting removed.
	active_chain.clear();
	hover_chain.clear();
	drag_hover_chain.clear();
}